

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O0

unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall Client::read_until<std::__cxx11::stringstream>(Client *this,string *pattern)

{
  ssize_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong in_RDX;
  int *in_RSI;
  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  in_RDI;
  long *in_FS_OFFSET;
  int read_count;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  undefined6 in_stack_ffffffffffffff28;
  byte bVar4;
  undefined1 uVar5;
  type in_stack_ffffffffffffff30;
  string local_80 [39];
  allocator local_59;
  string local_58 [52];
  int local_24;
  ulong local_18;
  
  local_18 = in_RDX;
  std::make_unique<std::__cxx11::stringstream>();
  do {
    sVar1 = read(*in_RSI,(void *)(*in_FS_OFFSET + -0x19400),0x400);
    local_24 = (int)sVar1;
    in_stack_ffffffffffffff30 =
         std::
         unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 + 0x10;
    lVar3 = *in_FS_OFFSET;
    uVar2 = (ulong)local_24;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)(lVar3 + -0x19400),uVar2,&local_59);
    std::operator<<((ostream *)in_stack_ffffffffffffff30,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x108865);
    std::__cxx11::stringstream::str();
    lVar3 = std::__cxx11::string::find(local_80,local_18);
    bVar4 = lVar3 != -1 || local_24 == 0;
    uVar5 = bVar4;
    std::__cxx11::string::~string(local_80);
    if ((bVar4 & 1) != 0) {
      std::
      unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffff30,
                   (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_ffffffffffffff28)));
      goto LAB_00108966;
    }
  } while (local_24 != -1);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff30,
             (nullptr_t)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_ffffffffffffff28)));
LAB_00108966:
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff30);
  return (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
}

Assistant:

std::unique_ptr<T> Client::read_until(const std::string& pattern) {
    std::unique_ptr<T> ss(std::make_unique<T>());

    while (true) {
        int read_count = read(socket , buffer, READ_BUFFER_SIZE); 
        *ss << std::string(buffer, read_count);
        if (ss->str().find(pattern) != std::string::npos || read_count == 0) {
            break;
        }
        if (read_count == EOF) {
            return nullptr;
        }
    }

    return ss;
}